

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O0

void __thiscall cnn::Cluster::new_graph(Cluster *this,ComputationGraph *cg)

{
  bool bVar1;
  reference ppCVar2;
  Cluster *in_RSI;
  ComputationGraph *in_RDI;
  Cluster *child;
  iterator __end1;
  iterator __begin1;
  vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *__range1;
  Cluster *in_stack_ffffffffffffffd0;
  __normal_iterator<cnn::Cluster_**,_std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>_>
  local_20;
  ComputationGraph *cg_00;
  
  cg_00 = in_RDI;
  local_20._M_current =
       (Cluster **)
       std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::begin
                 ((vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *)in_RDI);
  std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::end
            ((vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::Cluster_**,_std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<cnn::Cluster_**,_std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<cnn::Cluster_**,_std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffd0 = *ppCVar2;
    new_graph(in_RSI,cg_00);
    __gnu_cxx::
    __normal_iterator<cnn::Cluster_**,_std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>_>
    ::operator++(&local_20);
  }
  in_RDI[2].ee = (ExecutionEngine *)0x0;
  in_RDI[2].parameter_nodes.
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

void Cluster::new_graph(ComputationGraph& cg) {
  for (Cluster* child : children) {
    child->new_graph(cg);
  }
  bias.pg = NULL;
  weights.pg = NULL;
}